

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O3

void __thiscall
fizplex::BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test::TestBody
          (BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test *this)

{
  bool bVar1;
  ColMatrix *rhs;
  char *pcVar2;
  AssertionResult gtest_ar;
  ColMatrix inv;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  ColMatrix local_80;
  ColMatrix local_58;
  ColMatrix local_30;
  
  Base::get_inverse(&local_30,&(this->super_BaseTestRegularWithReordering).b);
  ColMatrix::identity(&local_80,3);
  rhs = &(this->super_BaseTestRegularWithReordering).m;
  ColMatrix::operator*(&local_58,&local_30,rhs);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            (local_90,"ColMatrix::identity(3)","inv * m",&local_80,&local_58);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_58.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)(((local_80.cols.
                     super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl
                     .super__Vector_impl_data._M_start)->values).
                   super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   ._M_impl.super__Vector_impl_data._M_start)->value)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ColMatrix::identity(&local_80,3);
  ColMatrix::operator*(&local_58,rhs,&local_30);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            (local_90,"ColMatrix::identity(3)","m * inv",&local_80,&local_58);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_58.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_80.cols);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.cols.super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)(((local_80.cols.
                     super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>._M_impl
                     .super__Vector_impl_data._M_start)->values).
                   super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   ._M_impl.super__Vector_impl_data._M_start)->value)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_30.cols);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, BaseMatrixTimesInverseIsIdentity) {
  const auto inv = b.get_inverse();
  EXPECT_EQ(ColMatrix::identity(3), inv * m);
  EXPECT_EQ(ColMatrix::identity(3), m * inv);
}